

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_pcall(lua_State *L,Pfunc func,void *u,ptrdiff_t old_top,ptrdiff_t ef)

{
  lu_byte lVar1;
  unsigned_short uVar2;
  CallInfo *pCVar3;
  ptrdiff_t pVar4;
  int iVar5;
  
  pCVar3 = L->ci;
  pVar4 = L->errfunc;
  lVar1 = L->allowhook;
  uVar2 = L->nny;
  L->errfunc = ef;
  iVar5 = luaD_rawrunprotected(L,func,u);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    L->ci = pCVar3;
    L->allowhook = lVar1;
    L->nny = uVar2;
    iVar5 = luaF_close(L,(StkId)((long)&L->stack->value_ + old_top),iVar5);
    luaD_seterrorobj(L,iVar5,(StkId)((long)&L->stack->value_ + old_top));
    luaD_shrinkstack(L);
  }
  L->errfunc = pVar4;
  return iVar5;
}

Assistant:

int luaD_pcall (lua_State *L, Pfunc func, void *u,
                ptrdiff_t old_top, ptrdiff_t ef) {
  int status;
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  unsigned short old_nny = L->nny;
  ptrdiff_t old_errfunc = L->errfunc;
  L->errfunc = ef;
  status = luaD_rawrunprotected(L, func, u);
  if (status != LUA_OK) {  /* an error occurred? */
    StkId oldtop = restorestack(L, old_top);
#ifndef RAVI_DEFER_STATEMENT
    luaF_close(L, oldtop);  /* close possible pending closures */
    luaD_seterrorobj(L, status, oldtop);
#endif
    L->ci = old_ci;
    L->allowhook = old_allowhooks;
    L->nny = old_nny;
#ifdef RAVI_DEFER_STATEMENT
    status = luaF_close(L, oldtop, status);  /* close possible pending closures */
    oldtop = restorestack(L, old_top);
    luaD_seterrorobj(L, status, oldtop);
#endif
    luaD_shrinkstack(L);
  }
  L->errfunc = old_errfunc;
  return status;
}